

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udbgutil.cpp
# Opt level: O0

int32_t paramTimezoneDefault
                  (USystemParams *param_1,char *target,int32_t targetCapacity,UErrorCode *status)

{
  UBool UVar1;
  int32_t iVar2;
  char local_168 [4];
  int32_t len;
  char buf2 [100];
  UChar local_f8 [4];
  UChar buf [100];
  UErrorCode *status_local;
  int32_t targetCapacity_local;
  char *target_local;
  USystemParams *param_0_local;
  
  buf._192_8_ = status;
  UVar1 = U_FAILURE(*status);
  if (UVar1 == '\0') {
    iVar2 = ucal_getDefaultTimeZone_63(local_f8,100,(UErrorCode *)buf._192_8_);
    UVar1 = U_SUCCESS(*(UErrorCode *)buf._192_8_);
    if ((UVar1 == '\0') || (iVar2 < 1)) {
      param_0_local._4_4_ = 0;
    }
    else {
      u_UCharsToChars_63(local_f8,local_168,iVar2 + 1);
      param_0_local._4_4_ =
           stringToStringBuffer(target,targetCapacity,local_168,(UErrorCode *)buf._192_8_);
    }
  }
  else {
    param_0_local._4_4_ = 0;
  }
  return param_0_local._4_4_;
}

Assistant:

U_CAPI  int32_t
paramTimezoneDefault(const USystemParams * /* param */, char *target, int32_t targetCapacity, UErrorCode *status) {
  if(U_FAILURE(*status))return 0;
  UChar buf[100];
  char buf2[100];
  int32_t len;

  len = ucal_getDefaultTimeZone(buf, 100, status);
  if(U_SUCCESS(*status)&&len>0) {
    u_UCharsToChars(buf, buf2, len+1);
    return stringToStringBuffer(target,targetCapacity, buf2,status);
  } else {
    return 0;
  }
}